

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial
              (char *source,char *dest,int compressedSize,int targetOutputSize,
              int maxDecompressedSize)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  BYTE *s_2;
  char *pcVar7;
  char *pcVar8;
  ushort *puVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  size_t __n;
  ushort *__src;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  ushort *puVar17;
  char *pcVar18;
  BYTE *d_1;
  char *pcVar19;
  bool bVar20;
  size_t dec64table [8];
  int local_a8;
  long local_78 [9];
  
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  pcVar8 = dest + (long)maxDecompressedSize + -0xc;
  pcVar18 = dest + targetOutputSize;
  if (pcVar8 < dest + targetOutputSize) {
    pcVar18 = pcVar8;
  }
  if (maxDecompressedSize != 0) {
    puVar9 = (ushort *)(source + compressedSize);
    pcVar16 = dest + maxDecompressedSize;
    pcVar1 = pcVar16 + -8;
    pcVar14 = dest;
    puVar17 = (ushort *)source;
switchD_00154f05_caseD_0:
    uVar4 = *puVar17;
    __src = (ushort *)((long)puVar17 + 1);
    uVar12 = (uint)(byte)((byte)uVar4 >> 4);
    __n = (size_t)uVar12;
    if (uVar12 == 0xf) {
      __n = 0xf;
      do {
        uVar5 = *__src;
        __src = (ushort *)((long)__src + 1);
        __n = __n + (byte)uVar5;
        if ((ushort *)((long)puVar9 - 0xfU) <= __src) break;
      } while ((byte)uVar5 == 0xff);
      if (-1 < (long)__n) goto LAB_00154dda;
LAB_00154e9a:
      pcVar19 = pcVar14;
      puVar17 = __src;
      uVar6 = 6;
    }
    else {
LAB_00154dda:
      pcVar19 = pcVar14 + __n;
      puVar17 = (ushort *)((long)__src + __n);
      if ((pcVar18 < pcVar19) || (puVar9 + -4 < puVar17)) {
        if ((pcVar16 < pcVar19) || (puVar9 < puVar17)) goto LAB_00154e9a;
        memcpy(pcVar14,__src,__n);
        uVar6 = 3;
      }
      else {
        do {
          *(undefined8 *)pcVar14 = *(undefined8 *)__src;
          pcVar14 = pcVar14 + 8;
          __src = __src + 4;
        } while (pcVar14 < pcVar19);
        pcVar14 = pcVar19 + -(ulong)*puVar17;
        puVar17 = puVar17 + 1;
        uVar6 = 6;
        if (dest <= pcVar14) {
          uVar10 = (ulong)((byte)uVar4 & 0xf);
          if (uVar10 == 0xf) {
            uVar10 = 0xf;
            do {
              if ((ushort *)((long)puVar9 - 5U) < puVar17) {
                bVar20 = false;
                uVar6 = 6;
                goto LAB_00154ea6;
              }
              uVar4 = *puVar17;
              puVar17 = (ushort *)((long)puVar17 + 1);
              uVar10 = uVar10 + (byte)uVar4;
            } while ((ulong)(byte)uVar4 == 0xff);
            bVar20 = -1 < (long)uVar10;
            uVar6 = 6;
            if (bVar20) {
              uVar6 = 0;
            }
LAB_00154ea6:
            if (!bVar20) goto LAB_00154ef3;
          }
          lVar15 = (long)pcVar19 - (long)pcVar14;
          if (lVar15 < 8) {
            lVar3 = *(long *)(&DAT_0015b250 + lVar15 * 8);
            pcVar13 = pcVar14 + (lVar3 - local_78[lVar15]);
            *pcVar19 = *pcVar14;
            pcVar19[1] = pcVar14[1];
            pcVar19[2] = pcVar14[2];
            pcVar19[3] = pcVar14[3];
            *(undefined4 *)(pcVar19 + 4) = *(undefined4 *)(pcVar14 + lVar3);
          }
          else {
            *(undefined8 *)pcVar19 = *(undefined8 *)pcVar14;
            pcVar13 = pcVar14 + 8;
          }
          pcVar14 = pcVar19 + uVar10 + 4;
          pcVar19 = pcVar19 + 8;
          if (pcVar8 < pcVar14) {
            uVar6 = 6;
            if (pcVar14 <= pcVar16 + -5) {
              pcVar7 = pcVar13;
              pcVar11 = pcVar19;
              if (pcVar19 < pcVar1) {
                do {
                  *(undefined8 *)pcVar11 = *(undefined8 *)pcVar7;
                  pcVar11 = pcVar11 + 8;
                  pcVar7 = pcVar7 + 8;
                } while (pcVar11 < pcVar1);
                pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar19);
                pcVar11 = pcVar1;
              }
              for (; pcVar19 = pcVar14, uVar6 = 0, pcVar11 < pcVar14; pcVar11 = pcVar11 + 1) {
                cVar2 = *pcVar13;
                pcVar13 = pcVar13 + 1;
                *pcVar11 = cVar2;
              }
            }
          }
          else {
            do {
              *(undefined8 *)pcVar19 = *(undefined8 *)pcVar13;
              pcVar19 = pcVar19 + 8;
              pcVar13 = pcVar13 + 8;
            } while (pcVar19 < pcVar14);
            pcVar19 = pcVar14;
            uVar6 = 0;
          }
        }
      }
    }
LAB_00154ef3:
    pcVar14 = pcVar19;
    switch(uVar6) {
    case 0:
    case 2:
      goto switchD_00154f05_caseD_0;
    default:
      goto switchD_00154f05_caseD_1;
    case 3:
      pcVar19 = (char *)(ulong)(uint)((int)pcVar19 - (int)dest);
      goto LAB_00154fbe;
    case 6:
      local_a8 = (int)source;
      pcVar19 = (char *)(ulong)(~(uint)puVar17 + local_a8);
      goto LAB_00154fbe;
    }
  }
  pcVar19 = (char *)0xffffffff;
  if (compressedSize == 1) {
    pcVar19 = (char *)(ulong)-(uint)(*source != '\0');
  }
LAB_00154fbe:
  return (int)pcVar19;
switchD_00154f05_caseD_1:
  goto LAB_00154fbe;
}

Assistant:

int LZ4_decompress_safe_partial(const char* source, char* dest, int compressedSize, int targetOutputSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize, endOnInputSize, partial, targetOutputSize, noDict, (BYTE*)dest, NULL, 0);
}